

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O0

char * utostr(uint64_t X,_Bool isNeg)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  char *result;
  char *BufPtr;
  char Buffer [22];
  _Bool isNeg_local;
  uint64_t X_local;
  
  result = Buffer + 0xd;
  Buffer[0xd] = '\0';
  unique0x1000008f = X;
  if (X == 0) {
    result = Buffer + 0xc;
    Buffer[0xc] = '0';
  }
  for (; stack0xfffffffffffffff0 != 0; register0x00000000 = stack0xfffffffffffffff0 / 10) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = stack0xfffffffffffffff0;
    result[-1] = SUB161(auVar1 % ZEXT816(10),0) + '0';
    result = result + -1;
  }
  if (isNeg) {
    result[-1] = '-';
    result = result + -1;
  }
  Buffer[0xf] = isNeg;
  pcVar2 = cs_strdup(result);
  return pcVar2;
}

Assistant:

static char *utostr(uint64_t X, bool isNeg)
{
	char Buffer[22];
	char *BufPtr = Buffer+21;
	char *result;

	Buffer[21] = '\0';
	if (X == 0) *--BufPtr = '0';  // Handle special case...

	while (X) {
		*--BufPtr = X % 10 + '0';
		X /= 10;
	}

	if (isNeg) *--BufPtr = '-';   // Add negative sign...

	result = cs_strdup(BufPtr);
	return result;
}